

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLDocument::Accept(XMLDocument *this,XMLVisitor *visitor)

{
  uint uVar1;
  int iVar2;
  XMLNode *local_20;
  XMLNode *node;
  XMLVisitor *visitor_local;
  XMLDocument *this_local;
  
  uVar1 = (*visitor->_vptr_XMLVisitor[2])();
  if ((uVar1 & 1) != 0) {
    local_20 = XMLNode::FirstChild(&this->super_XMLNode);
    while ((local_20 != (XMLNode *)0x0 &&
           (uVar1 = (*local_20->_vptr_XMLNode[0xe])(local_20,visitor), (uVar1 & 1) != 0))) {
      local_20 = XMLNode::NextSibling(local_20);
    }
  }
  iVar2 = (*visitor->_vptr_XMLVisitor[3])(visitor,this);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool XMLDocument::Accept( XMLVisitor* visitor ) const
{
    TIXMLASSERT( visitor );
    if ( visitor->VisitEnter( *this ) ) {
        for ( const XMLNode* node=FirstChild(); node; node=node->NextSibling() ) {
            if ( !node->Accept( visitor ) ) {
                break;
            }
        }
    }
    return visitor->VisitExit( *this );
}